

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_server_socket.c
# Opt level: O2

void test_init_fails_no_socket(void)

{
  cio_error cVar1;
  cio_server_socket ss;
  cio_eventloop loop;
  
  socket_fake.return_val = -1;
  alloc_client_fake.custom_fake = alloc_success;
  free_client_fake.custom_fake = free_success;
  cVar1 = cio_server_socket_init
                    (&ss,&loop,5,CIO_ADDRESS_FAMILY_INET4,alloc_client,free_client,10,on_close);
  if (cVar1 != CIO_SUCCESS) {
    UnityAssertEqualNumber(0,(ulong)close_fake.call_count,(char *)0x0,0x221,UNITY_DISPLAY_STYLE_INT)
    ;
    return;
  }
  UnityFail("Initialization of server socket did not failed!",0x220);
}

Assistant:

static void test_init_fails_no_socket(void)
{
	socket_fake.return_val = -1;

	struct cio_eventloop loop;
	struct cio_server_socket ss;

	alloc_client_fake.custom_fake = alloc_success;
	free_client_fake.custom_fake = free_success;

	enum cio_error err = cio_server_socket_init(&ss, &loop, 5, CIO_ADDRESS_FAMILY_INET4, alloc_client, free_client, 10, on_close);
	TEST_ASSERT_NOT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Initialization of server socket did not failed!");
	TEST_ASSERT_EQUAL(0, close_fake.call_count);
}